

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O1

void Sbd_StoComputeCutsObj(Sbd_Sto_t *p,int iObj,int Delay,int Level)

{
  uint uVar1;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  
  pVVar3 = p->vDelays;
  if (iObj < pVVar3->nSize) {
    if (-1 < iObj) {
      pVVar3->pArray[(uint)iObj] = Delay;
      if (iObj < p->vLevels->nSize) {
        p->vLevels->pArray[(uint)iObj] = Level;
        return;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  if (pVVar3->nSize != iObj) {
    __assert_fail("iObj == Vec_IntSize(p->vDelays)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2c7,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
  }
  if (p->vLevels->nSize != iObj) {
    __assert_fail("iObj == Vec_IntSize(p->vLevels)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2c8,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
  }
  if (p->vCuts->nSize != iObj) {
    __assert_fail("iObj == Vec_WecSize(p->vCuts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2c9,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
  }
  Vec_IntPush(pVVar3,Delay);
  Vec_IntPush(p->vLevels,Level);
  pVVar2 = p->vCuts;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (Vec_Int_t *)0x0) {
        pVVar3 = (Vec_Int_t *)malloc(0x100);
      }
      else {
        pVVar3 = (Vec_Int_t *)realloc(pVVar2->pArray,0x100);
      }
      pVVar2->pArray = pVVar3;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_0053bd18;
      if (pVVar2->pArray == (Vec_Int_t *)0x0) {
        pVVar3 = (Vec_Int_t *)malloc((ulong)uVar1 << 5);
      }
      else {
        pVVar3 = (Vec_Int_t *)realloc(pVVar2->pArray,(ulong)uVar1 << 5);
      }
      pVVar2->pArray = pVVar3;
    }
    memset(pVVar3 + pVVar2->nCap,0,((long)iVar4 - (long)pVVar2->nCap) * 0x10);
    pVVar2->nCap = iVar4;
  }
LAB_0053bd18:
  iVar4 = pVVar2->nSize;
  pVVar2->nSize = iVar4 + 1;
  if (-1 < iVar4) {
    return;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
}

Assistant:

void Sbd_StoComputeCutsObj( Sbd_Sto_t * p, int iObj, int Delay, int Level )
{
    if ( iObj < Vec_IntSize(p->vDelays) )
    {
        Vec_IntWriteEntry( p->vDelays, iObj, Delay );
        Vec_IntWriteEntry( p->vLevels, iObj, Level );
    }
    else
    {
        assert( iObj == Vec_IntSize(p->vDelays) );
        assert( iObj == Vec_IntSize(p->vLevels) );
        assert( iObj == Vec_WecSize(p->vCuts) );
        Vec_IntPush( p->vDelays, Delay );
        Vec_IntPush( p->vLevels, Level );
        Vec_WecPushLevel( p->vCuts );
    }
}